

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileToString.cpp
# Opt level: O2

ComparisonStatusFlags __thiscall
Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::FileToString>::operator()
          (Comparator<Corrade::TestSuite::Compare::FileToString> *this,StringView filename,
          StringView expectedContents)

{
  byte bVar1;
  State *pSVar2;
  Optional<Corrade::Containers::String> actualContents;
  String local_78;
  Optional<Corrade::Containers::String> local_60;
  undefined8 local_40;
  undefined8 local_38;
  
  pSVar2 = Containers::
           Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::FileToString>::State>
           ::operator->(&this->_state);
  (pSVar2->filename)._data = filename._data;
  (pSVar2->filename)._sizePlusFlags = filename._sizePlusFlags;
  Corrade::Utility::Path::readString(&local_60,filename._data,filename._sizePlusFlags);
  bVar1 = 1;
  if (local_60._set != false) {
    Containers::Optional<Corrade::Containers::String>::operator*(&local_78,&local_60);
    pSVar2 = Containers::
             Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::FileToString>::State>
             ::operator->(&this->_state);
    Corrade::Containers::String::operator=(&pSVar2->actualContents,&local_78);
    Corrade::Containers::String::~String(&local_78);
    pSVar2 = Containers::
             Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::FileToString>::State>
             ::operator->(&this->_state);
    (pSVar2->expectedContents)._data = expectedContents._data;
    (pSVar2->expectedContents)._sizePlusFlags = expectedContents._sizePlusFlags;
    pSVar2 = Containers::
             Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::FileToString>::State>
             ::operator->(&this->_state);
    pSVar2->result = Success;
    Containers::
    Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::FileToString>::State>::
    operator->(&this->_state);
    Corrade::Containers::BasicStringView<char_const>::BasicStringView
              ((String *)&stack0xffffffffffffffc0);
    bVar1 = Corrade::Containers::operator==
                      (local_40,local_38,expectedContents._data,expectedContents._sizePlusFlags);
    bVar1 = bVar1 ^ 1;
  }
  Containers::Optional<Corrade::Containers::String>::~Optional(&local_60);
  return (ComparisonStatusFlags)bVar1;
}

Assistant:

ComparisonStatusFlags Comparator<Compare::FileToString>::operator()(const Containers::StringView filename, const Containers::StringView expectedContents) {
    _state->filename = filename;

    Containers::Optional<Containers::String> actualContents = Utility::Path::readString(filename);
    if(!actualContents)
        return ComparisonStatusFlag::Failed;

    _state->actualContents = *Utility::move(actualContents);
    _state->expectedContents = expectedContents;
    _state->result = Result::Success;

    return _state->actualContents == expectedContents ? ComparisonStatusFlags{} :
        ComparisonStatusFlag::Failed;
}